

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

void __thiscall
Fossilize::ConcurrentDatabase::ConcurrentDatabase
          (ConcurrentDatabase *this,char *base_path_,DatabaseMode mode_,char **extra_paths,
          size_t num_extra_paths)

{
  pointer *ppuVar1;
  size_type sVar2;
  pointer pcVar3;
  DatabaseInterface *pDVar4;
  iterator __position;
  size_t sVar5;
  __node_base_ptr *pp_Var6;
  DatabaseInterface *pDVar7;
  long lVar8;
  size_t sVar9;
  char *__s;
  string readonly_path;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> local_50 [2];
  DatabaseInterface local_40;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface =
       (_func_int **)&PTR__ConcurrentDatabase_00169c78;
  __s = "";
  if (base_path_ != (char *)0x0) {
    __s = base_path_;
  }
  (this->base_path)._M_dataplus._M_p = (pointer)&(this->base_path).field_2;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->base_path,__s,__s + sVar5);
  (this->bucket_dirname)._M_dataplus._M_p = (pointer)&(this->bucket_dirname).field_2;
  (this->bucket_dirname)._M_string_length = 0;
  (this->bucket_dirname).field_2._M_local_buf[0] = '\0';
  (this->bucket_basename)._M_dataplus._M_p = (pointer)&(this->bucket_basename).field_2;
  (this->bucket_basename)._M_string_length = 0;
  (this->bucket_basename).field_2._M_local_buf[0] = '\0';
  this->mode = mode_;
  (this->readonly_interface)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (this->writeonly_interface)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extra_readonly).
  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp_Var6 = &this->primed_hashes[0]._M_h._M_single_bucket;
  lVar8 = 0x230;
  do {
    ((_Hashtable *)(pp_Var6 + -6))->_M_buckets = pp_Var6;
    pp_Var6[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var6 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var6[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var6 + -2))->_M_max_load_factor = 1.0;
    pp_Var6[-1] = (__node_base_ptr)0x0;
    *pp_Var6 = (__node_base_ptr)0x0;
    pp_Var6 = pp_Var6 + 7;
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != 0);
  this->has_prepared_readonly = false;
  this->need_writeonly_database = true;
  if (this->mode != OverWrite) {
    if (this->mode == ExclusiveOverWrite) {
      this->mode = OverWrite;
    }
    else {
      sVar2 = (this->base_path)._M_string_length;
      if (sVar2 != 0) {
        local_50[0]._M_head_impl = &local_40;
        pcVar3 = (this->base_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar3,pcVar3 + sVar2);
        std::__cxx11::string::append((char *)local_50);
        pDVar7 = create_stream_archive_database(local_50[0]._M_head_impl,ReadOnly);
        pDVar4 = (this->readonly_interface)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->readonly_interface)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar7;
        if (pDVar4 != (DatabaseInterface *)0x0) {
          (*pDVar4->_vptr_DatabaseInterface[1])();
        }
        if (local_50[0]._M_head_impl != &local_40) {
          operator_delete(local_50[0]._M_head_impl,(long)local_40._vptr_DatabaseInterface + 1);
        }
      }
      if (num_extra_paths != 0) {
        sVar9 = 0;
        do {
          local_50[0]._M_head_impl = create_stream_archive_database(extra_paths[sVar9],ReadOnly);
          __position._M_current =
               (this->extra_readonly).
               super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->extra_readonly).
              super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
            ::_M_realloc_insert<Fossilize::DatabaseInterface*>
                      ((vector<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>,std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>>>
                        *)&this->extra_readonly,__position,&local_50[0]._M_head_impl);
          }
          else {
            ((__position._M_current)->_M_t).
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                 local_50[0]._M_head_impl;
            ppuVar1 = &(this->extra_readonly).
                       super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          sVar9 = sVar9 + 1;
        } while (num_extra_paths != sVar9);
      }
    }
  }
  return;
}

Assistant:

explicit ConcurrentDatabase(const char *base_path_, DatabaseMode mode_,
	                            const char * const *extra_paths, size_t num_extra_paths)
		: DatabaseInterface(mode_), base_path(base_path_ ? base_path_ : ""), mode(mode_)
	{
		// Normalize this mode. The concurrent database is always "exclusive write".
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;

		if (mode != DatabaseMode::OverWrite)
		{
			if (!base_path.empty())
			{
				std::string readonly_path = base_path + ".foz";
				readonly_interface.reset(create_stream_archive_database(readonly_path.c_str(), DatabaseMode::ReadOnly));
			}

			for (size_t i = 0; i < num_extra_paths; i++)
				extra_readonly.emplace_back(create_stream_archive_database(extra_paths[i], DatabaseMode::ReadOnly));
		}
	}